

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview_p.h
# Opt level: O1

void __thiscall
QColumnViewPreviewColumn::resizeEvent(QColumnViewPreviewColumn *this,QResizeEvent *event)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QWidgetData *pQVar5;
  QSize QVar6;
  QWidget *pQVar7;
  QScrollBar *pQVar8;
  int step;
  int step_00;
  long in_FS_OFFSET;
  QSize local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = this->previewWidget;
  if (pQVar7 != (QWidget *)0x0) {
    QVar6 = QWidget::minimumSize(pQVar7);
    local_40.wd.m_i = QVar6.wd.m_i.m_i;
    if (QVar6.wd.m_i.m_i < *(int *)(event + 0x10)) {
      local_40.wd.m_i = *(int *)(event + 0x10);
    }
    pQVar5 = this->previewWidget->data;
    local_40.ht.m_i = ((pQVar5->crect).y2.m_i - (pQVar5->crect).y1.m_i) + 1;
    QWidget::resize(pQVar7,&local_40);
    pQVar7 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
    pQVar5 = pQVar7->data;
    step_00 = ((pQVar5->crect).x2.m_i - (pQVar5->crect).x1.m_i) + 1;
    step = ((pQVar5->crect).y2.m_i - (pQVar5->crect).y1.m_i) + 1;
    pQVar5 = this->previewWidget->data;
    iVar1 = (pQVar5->crect).x2.m_i;
    iVar2 = (pQVar5->crect).y2.m_i;
    iVar3 = (pQVar5->crect).x1.m_i;
    iVar4 = (pQVar5->crect).y1.m_i;
    pQVar8 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    QAbstractSlider::setRange(&pQVar8->super_QAbstractSlider,0,(iVar1 - (iVar3 + step_00)) + 1);
    pQVar8 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    QAbstractSlider::setPageStep(&pQVar8->super_QAbstractSlider,step_00);
    pQVar8 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    QAbstractSlider::setRange(&pQVar8->super_QAbstractSlider,0,(iVar2 - (iVar4 + step)) + 1);
    pQVar8 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    QAbstractSlider::setPageStep(&pQVar8->super_QAbstractSlider,step);
    QAbstractScrollArea::resizeEvent((QAbstractScrollArea *)this,event);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void resizeEvent(QResizeEvent * event) override{
        if (!previewWidget)
            return;
        previewWidget->resize(
                qMax(previewWidget->minimumWidth(), event->size().width()),
                previewWidget->height());
        QSize p = viewport()->size();
        QSize v = previewWidget->size();
        horizontalScrollBar()->setRange(0, v.width() - p.width());
        horizontalScrollBar()->setPageStep(p.width());
        verticalScrollBar()->setRange(0, v.height() - p.height());
        verticalScrollBar()->setPageStep(p.height());

        QAbstractScrollArea::resizeEvent(event);
    }